

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrusive-list.h
# Opt level: O0

void __thiscall wabt::intrusive_list<wabt::Expr>::clear(intrusive_list<wabt::Expr> *this)

{
  Expr *pEVar1;
  Expr *next;
  Expr *iter;
  intrusive_list<wabt::Expr> *this_local;
  
  pEVar1 = this->first_;
  while (next = pEVar1, next != (Expr *)0x0) {
    pEVar1 = (next->super_intrusive_list_base<wabt::Expr>).next_;
    if (next != (Expr *)0x0) {
      (*next->_vptr_Expr[1])();
    }
  }
  this->last_ = (Expr *)0x0;
  this->first_ = (Expr *)0x0;
  this->size_ = 0;
  return;
}

Assistant:

inline void intrusive_list<T>::clear() noexcept {
  for (T* iter = first_; iter;) {
    T* next = iter->next_;
    delete iter;
    iter = next;
  }
  first_ = last_ = nullptr;
  size_ = 0;
}